

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDP_Solver.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  iterator iVar1;
  bool bVar2;
  DecPOMDPDiscreteInterface *pDVar3;
  NullPlanner *this;
  MDPPolicyIteration *this_00;
  ostream *poVar4;
  long *plVar5;
  double *pdVar6;
  string methodName;
  vector<double,_std::allocator<double>_> avgRewards;
  string filename;
  double r;
  string timingsFilename;
  QTable q;
  Timing Time;
  stringstream ss;
  SimulationDecPOMDPDiscrete sim;
  stringstream ss_1;
  Arguments args;
  undefined1 *local_718;
  char *local_710;
  undefined1 local_708;
  undefined7 uStack_707;
  double *local_6f8;
  iterator iStack_6f0;
  double *local_6e8;
  string local_6d8;
  double local_6b8;
  long *local_6b0 [2];
  long local_6a0 [2];
  long *local_690;
  long local_688;
  long local_680 [2];
  long *local_670;
  long local_668;
  long local_660 [2];
  long *local_650 [2];
  long local_640 [2];
  QTable local_630 [32];
  long local_610;
  void *local_608;
  Timing local_600 [56];
  long *local_5c8 [2];
  long local_5b8 [14];
  ios_base local_548 [264];
  SimulationDecPOMDPDiscrete local_440 [80];
  long *local_3f0;
  long local_3e8;
  long local_3e0 [14];
  ios_base local_370 [264];
  Arguments local_268;
  
  ArgumentHandlers::Arguments::Arguments(&local_268);
  argp_parse(ArgumentHandlers::theArgpStruc,argc,argv,0,0,&local_268);
  Timing::Timing(local_600);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Instantiating the problem...",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  pDVar3 = (DecPOMDPDiscreteInterface *)
           ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs(&local_268);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"...done.",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  this = (NullPlanner *)operator_new(0x338);
  NullPlanner::NullPlanner
            (this,(long)local_268.horizon,pDVar3,(PlanningUnitMADPDiscreteParameters *)0x0);
  local_718 = &local_708;
  local_710 = (char *)0x0;
  local_708 = 0;
  if (local_268.mmdp_method == ValueIteration) {
    this_00 = (MDPPolicyIteration *)operator_new(0x40);
    MDPValueIteration::MDPValueIteration
              ((MDPValueIteration *)this_00,(PlanningUnitDecPOMDPDiscrete *)this);
    std::__cxx11::string::_M_replace((ulong)&local_718,0,local_710,0x106196);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Running value iteration...",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
  }
  else {
    if (local_268.mmdp_method != PolicyIteration) {
      if (local_268.mmdp_method == PolicyIterationGPU) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "No \'MDPPolicyIterationGPU\' available. Install cuda, reconfigure and recompile."
                   ,0x4e);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unkown mmdp_method",0x12);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      }
      exit(1);
    }
    this_00 = (MDPPolicyIteration *)operator_new(0x40);
    MDPPolicyIteration::MDPPolicyIteration(this_00,(PlanningUnitDecPOMDPDiscrete *)this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Running policy iteration...",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    std::__cxx11::string::_M_replace((ulong)&local_718,0,local_710,0x1061dc);
  }
  local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d8,"/dev/null","");
  local_6b0[0] = local_6a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6b0,"/dev/null","");
  if (local_268.dryrun == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_5c8);
    directories::MADPGetResultsFilename
              ((string *)&local_3f0,(MultiAgentDecisionProcessInterface *)&local_718,
               (Arguments *)(pDVar3 + *(long *)(*(long *)pDVar3 + -0x40)));
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_5b8,(char *)local_3f0,local_3e8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_h",2);
    std::ostream::operator<<(poVar4,local_268.horizon);
    if (local_3f0 != local_3e0) {
      operator_delete(local_3f0,local_3e0[0] + 1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_6d8,(string *)&local_3f0);
    if (local_3f0 != local_3e0) {
      operator_delete(local_3f0,local_3e0[0] + 1);
    }
    local_3f0 = local_3e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3f0,local_6d8._M_dataplus._M_p,
               local_6d8._M_dataplus._M_p + local_6d8._M_string_length);
    std::__cxx11::string::append((char *)&local_3f0);
    std::__cxx11::string::operator=((string *)local_6b0,(string *)&local_3f0);
    if (local_3f0 != local_3e0) {
      operator_delete(local_3f0,local_3e0[0] + 1);
    }
    bVar2 = file_exists(&local_6d8);
    if (!bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"MMDP_Solver: could not open ",0x1c);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_6d8._M_dataplus._M_p,
                          local_6d8._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Results will not be stored to disk.",0x23);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
      local_268.dryrun = 1;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_5c8);
    std::ios_base::~ios_base(local_548);
  }
  local_5c8[0] = local_5b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c8,"Plan","");
  Timing::Start((string *)local_600);
  if (local_5c8[0] != local_5b8) {
    operator_delete(local_5c8[0],local_5b8[0] + 1);
  }
  (**(code **)(*(long *)this_00 + 0x10))(this_00);
  local_5c8[0] = local_5b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c8,"Plan","");
  Timing::Stop((string *)local_600);
  if (local_5c8[0] != local_5b8) {
    operator_delete(local_5c8[0],local_5b8[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"...done.",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  (**(code **)(*(long *)this_00 + 0x50))(local_630,this_00,0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Simulating policy with nrRuns: ",0x1f);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_268.nrRuns);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," and seed: ",0xb);
  plVar5 = (long *)std::ostream::operator<<(poVar4,local_268.randomSeed);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  SimulationDecPOMDPDiscrete::SimulationDecPOMDPDiscrete
            (local_440,(PlanningUnitDecPOMDPDiscrete *)this,local_268.nrRuns,local_268.randomSeed,
             false);
  if (local_268.dryrun == 0) {
    local_650[0] = local_640;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_650,local_6d8._M_dataplus._M_p,
               local_6d8._M_dataplus._M_p + local_6d8._M_string_length);
    SimulationDecPOMDPDiscrete::SaveIntermediateResults(local_440,local_650);
    if (local_650[0] != local_640) {
      operator_delete(local_650[0],local_640[0] + 1);
    }
  }
  local_6f8 = (double *)0x0;
  iStack_6f0._M_current = (double *)0x0;
  local_6e8 = (double *)0x0;
  local_6b8 = runOneSimulation(local_630,(PlanningUnitDecPOMDPDiscrete *)this,local_440);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"...done",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  if (iStack_6f0._M_current == local_6e8) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&local_6f8,iStack_6f0,&local_6b8);
  }
  else {
    *iStack_6f0._M_current = local_6b8;
    iStack_6f0._M_current = iStack_6f0._M_current + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Avg rewards: ",0xd);
  std::__cxx11::stringstream::stringstream((stringstream *)&local_3f0);
  iVar1._M_current = iStack_6f0._M_current;
  pdVar6 = local_6f8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3e0,"< ",2);
  if (pdVar6 != iVar1._M_current) {
    do {
      if (pdVar6 != local_6f8) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3e0,", ",2);
      }
      std::__cxx11::stringstream::stringstream((stringstream *)local_5c8);
      std::ostream::_M_insert<double>(*pdVar6);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_5c8);
      std::ios_base::~ios_base(local_548);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3e0,(char *)local_690,local_688);
      if (local_690 != local_680) {
        operator_delete(local_690,local_680[0] + 1);
      }
      pdVar6 = pdVar6 + 1;
    } while (pdVar6 != iVar1._M_current);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3e0," >",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_3f0);
  std::ios_base::~ios_base(local_370);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_670,local_668);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (local_670 != local_660) {
    operator_delete(local_670,local_660[0] + 1);
  }
  if (local_268.dryrun == 0) {
    Timing::Save((string *)local_600);
  }
  if (local_6f8 != (double *)0x0) {
    operator_delete(local_6f8,(long)local_6e8 - (long)local_6f8);
  }
  SimulationDecPOMDPDiscrete::~SimulationDecPOMDPDiscrete(local_440);
  if (local_610 != 0) {
    operator_delete(local_608,local_610 << 3);
  }
  if (local_6b0[0] != local_6a0) {
    operator_delete(local_6b0[0],local_6a0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
    operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
  }
  if (local_718 != &local_708) {
    operator_delete(local_718,CONCAT71(uStack_707,local_708) + 1);
  }
  Timing::~Timing(local_600);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.maxplus_updateT._M_dataplus._M_p != &local_268.maxplus_updateT.field_2) {
    operator_delete(local_268.maxplus_updateT._M_dataplus._M_p,
                    local_268.maxplus_updateT.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    ArgumentHandlers::Arguments args;
    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);

    try
    {
        Timing Time;
        cout << "Instantiating the problem..."<<endl;
        DecPOMDPDiscreteInterface* decpomdp = GetDecPOMDPDiscreteInterfaceFromArgs(args);
        cout << "...done."<<endl;

        //construct MMDP_Solver
        PlanningUnitDecPOMDPDiscrete *np = new NullPlanner(args.horizon, decpomdp);
        MDPSolver *mdpSolver=NULL;
        string methodName;
        switch (args.mmdp_method)
        {
        case ArgumentHandlers::ValueIteration:
            mdpSolver=new MDPValueIteration(*np);
            methodName="MMDP_Solver_VI";
            cout << "Running value iteration..."<<endl;
            break;
        case ArgumentHandlers::PolicyIteration:
            mdpSolver=new MDPPolicyIteration(*np);
            cout << "Running policy iteration..."<<endl;
            methodName="MMDP_Solver_PI";
            break;
        case ArgumentHandlers::PolicyIterationGPU:
#if HAVE_CUDA_CUSOLVERDN_H
            mdpSolver=new MDPPolicyIterationGPU(*np);
            cout << "Running GPU supported policy iteration..."<<endl;
            methodName="MMDP_Solver_PIgpu";
#else
            cerr<<"No 'MDPPolicyIterationGPU' available. Install cuda, reconfigure and recompile."<<endl;
            exit(1);
#endif
            break;
        default:
            cerr<<"Unkown mmdp_method"<<endl;
            exit(1);
        }

        //set up output files
        string filename="/dev/null", timingsFilename="/dev/null";
        if(!args.dryrun)
        {
            stringstream ss;
            ss  << directories::MADPGetResultsFilename(methodName, *decpomdp, args)
                << "_h" << args.horizon;
            filename=ss.str();
            timingsFilename=filename + "_Timings";
            if(!file_exists(filename))
            {
                cout << "MMDP_Solver: could not open " << filename <<endl;
                cout << "Results will not be stored to disk." <<endl;
                args.dryrun = true;
            }
        }

        //start planning
        Time.Start("Plan");
        mdpSolver->Plan(); // calls PlanSlow() on MDPPolicyIteration and MDPPolicyIterationGPU objects

        Time.Stop("Plan");
        cout << "...done."<<endl;
        QTable q = mdpSolver->GetQTable(0); //<- infinite horizon, so get 1 value function of stage 0

        int nrRuns = args.nrRuns; //defaults to 1000, see argumentHandlers.h
        int seed = args.randomSeed; //defaults to 42
        cout << "Simulating policy with nrRuns: " << nrRuns << " and seed: " << seed <<endl;
        SimulationDecPOMDPDiscrete sim(*np, nrRuns, seed);

        //write intermediate simulation results to file
        if(!args.dryrun)
            sim.SaveIntermediateResults(filename);

        vector<double> avgRewards;
        double r = runOneSimulation(q, np, sim);
        cout << "...done"<<endl;

        avgRewards.push_back(r);
        cout << "Avg rewards: " << SoftPrintVector(avgRewards) << endl;

        //write MDPSOLVER timing information to file
        if(!args.dryrun)
            Time.Save(timingsFilename);
    }
    catch(E& e){ e.Print(); }

    return(0);
}